

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
jessilib::split_once<std::__cxx11::string,char_const*,char_const*,char>
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,jessilib *this,char *begin,char *end,char in_delim)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  jessilib *pjVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar2 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pjVar4 = this;
  if (this < begin) {
    do {
      local_90._M_dataplus._M_p = (pointer)paVar2;
      local_70._M_dataplus._M_p = (pointer)paVar3;
      if (*pjVar4 == SUB81(end,0)) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,this,pjVar4);
        split_once<std::__cxx11::string,char_const*,char_const*,char>();
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pjVar4 + 1,begin);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_70,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00134918;
        goto LAB_00134925;
      }
      pjVar4 = pjVar4 + 1;
    } while (pjVar4 != (jessilib *)begin);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,this,begin);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_90,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00134918:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
LAB_00134925:
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
      *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) =
           CONCAT17(local_90.field_2._M_local_buf[0xf],
                    CONCAT25(local_90.field_2._13_2_,
                             CONCAT41(local_90.field_2._9_4_,local_90.field_2._M_local_buf[8])));
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = local_90._M_dataplus._M_p;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity =
           CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->first)._M_string_length = local_90._M_string_length;
    paVar2 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar3) {
      paVar2->_M_allocated_capacity =
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_70.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = local_70._M_dataplus._M_p;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity =
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
    }
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 1) =
         CONCAT17(local_90.field_2._M_local_buf[8],local_90.field_2._M_allocated_capacity._1_7_);
    *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 9) = local_90.field_2._9_4_;
    *(undefined2 *)((long)&(__return_storage_ptr__->first).field_2 + 0xd) = local_90.field_2._13_2_;
    (__return_storage_ptr__->first).field_2._M_local_buf[0xf] = local_90.field_2._M_local_buf[0xf];
    local_70._M_string_length = 0;
    (__return_storage_ptr__->first)._M_string_length = 0;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity =
         (ulong)(uint7)local_70.field_2._M_allocated_capacity._1_7_ << 8;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_70.field_2._8_8_;
  }
  (__return_storage_ptr__->second)._M_string_length = local_70._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}